

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

void __thiscall JSONNode::set_comment(JSONNode *this,json_string *newname)

{
  internalJSONNode *piVar1;
  allocator local_39;
  json_string local_38;
  
  piVar1 = this->internal;
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  makeUniqueInternal(this);
  internalJSONNode::setcomment(this->internal,newname);
  return;
}

Assistant:

inline void JSONNode::set_comment(const json_string & newname) json_nothrow{
	   JSON_CHECK_INTERNAL();
	   makeUniqueInternal();
	   internal -> setcomment(newname);
    }